

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O0

void __thiscall
burst::detail::
join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
::forward(join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
          *this,difference_type n)

{
  int *__first;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *this_00;
  int *__last;
  long *plVar1;
  long items_to_scroll_in_current_range;
  difference_type items_remaining_in_current_range;
  difference_type n_local;
  join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
  *this_local;
  
  items_remaining_in_current_range = n;
  n_local = (difference_type)this;
  while (0 < items_remaining_in_current_range) {
    __first = this->m_inner;
    this_00 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
              __gnu_cxx::
              __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
              ::operator->(&this->m_outer);
    __last = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::end
                       (this_00);
    items_to_scroll_in_current_range = std::distance<int_const*>(__first,__last);
    plVar1 = std::min<long>(&items_remaining_in_current_range,&items_to_scroll_in_current_range);
    items_remaining_in_current_range = items_remaining_in_current_range - *plVar1;
    this->m_inner = this->m_inner + *plVar1;
    maintain_invariant(this);
  }
  return;
}

Assistant:

void forward (typename base_type::difference_type n)
            {
                while (n > 0)
                {
                    auto items_remaining_in_current_range = std::distance(m_inner, m_outer->end());
                    auto items_to_scroll_in_current_range = std::min(n, items_remaining_in_current_range);
                    n -= items_to_scroll_in_current_range;
                    m_inner += items_to_scroll_in_current_range;

                    maintain_invariant();
                }
            }